

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O1

void DumpData(Res res,DataType dt,int nchan,void *data,string *prefix)

{
  int iVar1;
  float *dst;
  void *dst_00;
  ostream *poVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ushort local_6c;
  
  dst = (float *)malloc((long)nchan * 4);
  dst_00 = malloc((long)nchan);
  uVar6 = 1 << (res.ulog2 & 0x1fU);
  uVar4 = 1 << (res.vlog2 & 0x1fU);
  printf("%sdata (%d x %d):\n",(prefix->_M_dataplus)._M_p,(ulong)uVar6,(ulong)uVar4);
  if (res.vlog2 != 0x1f) {
    local_6c = (ushort)res & 0xff;
    iVar1 = *(int *)(Ptex::v2_4::DataSize(Ptex::v2_4::DataType)::sizes + (ulong)dt * 4);
    iVar3 = 0;
    do {
      if (iVar3 == 8 && 0x10 < (int)uVar4) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,
                            prefix->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ...",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        iVar3 = uVar4 - 8;
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      if (local_6c != 0x1f) {
        iVar5 = 0;
        do {
          if (iVar5 == 8 && 0x10 < (int)uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
            iVar5 = uVar6 - 8;
          }
          Ptex::v2_4::ConvertToFloat
                    (dst,(void *)((long)(((iVar3 << (res.ulog2 & 0x1fU)) + iVar5) * iVar1 * nchan) +
                                 (long)data),dt,nchan);
          Ptex::v2_4::ConvertFromFloat(dst_00,dst,dt_uint8,nchan);
          if (0 < nchan) {
            uVar7 = 0;
            do {
              printf("%02x",(ulong)*(byte *)((long)dst_00 + uVar7));
              uVar7 = uVar7 + 1;
            } while ((uint)nchan != uVar7);
          }
          putchar(0x20);
          iVar5 = iVar5 + 1;
        } while (iVar5 < (int)uVar6);
      }
      putchar(10);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)uVar4);
  }
  free(dst_00);
  free(dst);
  return;
}

Assistant:

void DumpData(Ptex::Res res, Ptex::DataType dt, int nchan, void* data, std::string prefix)
{
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    uint8_t* cpixel = (uint8_t*) malloc(sizeof(uint8_t)*nchan);
    printf("%sdata (%d x %d):\n", prefix.c_str(), res.u(), res.v());
    int ures = res.u(), vres = res.v();
    int pixelSize = Ptex::DataSize(dt) * nchan;
        
    for (int vi = 0; vi < vres; vi++) {
        if (vi == 8 && vres > 16) { vi = vres-8; std::cout << prefix << "  ..." << std::endl; }
        std::cout << prefix << "  ";
        for (int ui = 0; ui < ures; ui++) {
            if (ui == 8 && ures > 16) { ui = ures-8; std::cout << "... "; }
            uint8_t* dpixel = (uint8_t*)data + (vi * ures + ui) * pixelSize;
            Ptex::ConvertToFloat(pixel, dpixel, dt, nchan);
            Ptex::ConvertFromFloat(cpixel, pixel, Ptex::dt_uint8, nchan);
            for (int c=0; c < nchan; c++) {
                printf("%02x", cpixel[c]);
            }
            printf(" ");
        }
        printf("\n");
    }

    free(cpixel);
    free(pixel);
}